

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O1

void __thiscall
ValueHashTable<ExprHash,_Value_*>::And
          (ValueHashTable<ExprHash,_Value_*> *this,ValueHashTable<ExprHash,_Value_*> *this2)

{
  ExprHash EVar1;
  SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  Value *pVVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  DictionaryStats *this_01;
  code *pcVar4;
  NodeBase *pNVar5;
  bool bVar6;
  undefined4 *puVar7;
  Type *pTVar8;
  Type *pTVar9;
  ulong uVar10;
  undefined1 local_60 [8];
  EditingIterator iter;
  undefined1 local_40 [8];
  Iterator iter2;
  
  if (this->tableSize != 0) {
    iter.last = (NodeBase *)this;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pNVar5 = iter.last;
    uVar10 = 0;
    do {
      local_40 = (undefined1  [8])(this2->table + uVar10);
      iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                   local_40;
      if (local_40 == (undefined1  [8])0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar6) {
LAB_0049c0dd:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
      }
      pSVar2 = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
               ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                   0x0;
      if ((undefined1  [8])pSVar2 != local_40) {
        iter2.list = pSVar2;
      }
      local_60 = (undefined1  [8])(iter.last[2].next + uVar10 * 2);
      iter.super_Iterator.current = (NodeBase *)0x0;
      iter.super_Iterator.list =
           (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_60;
      while( true ) {
        bVar6 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::Next((EditingIterator *)local_60);
        if (!bVar6) break;
        pTVar8 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                 Iterator::Data((Iterator *)local_60);
        if ((iter2.list !=
             (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
           ((undefined1  [8])iter2.list != local_40)) {
          while (EVar1 = pTVar8->value,
                pTVar9 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                         ::Iterator::Data((Iterator *)local_40), (uint)EVar1 < (uint)pTVar9->value)
          {
            if (iter2.list ==
                (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0)
            {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar6) goto LAB_0049c0dd;
              *puVar7 = 0;
            }
            pSVar2 = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                     ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
            iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                          *)0x0;
            if ((undefined1  [8])pSVar2 != local_40) {
              iter2.list = pSVar2;
            }
            if ((iter2.list ==
                 (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0)
               || ((undefined1  [8])iter2.list == local_40)) break;
          }
        }
        if ((iter2.list ==
             (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
           ((((undefined1  [8])iter2.list == local_40 ||
             (EVar1 = pTVar8->value,
             pTVar9 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                      Iterator::Data((Iterator *)local_40), EVar1 != pTVar9->value)) ||
            (pVVar3 = pTVar8->element,
            pTVar9 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)local_40), pVVar3 != pTVar9->element)))) {
          pSVar2 = iter.super_Iterator.list;
          this_00 = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                    pNVar5->next;
          SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
          EditingIterator::UnlinkCurrentNode((EditingIterator *)local_60);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    (this_00,pSVar2,0x18);
          this_01 = (DictionaryStats *)pNVar5[3].next;
          if (this_01 != (DictionaryStats *)0x0) {
            DictionaryStats::Remove(this_01,false);
          }
        }
        else {
          EVar1 = pTVar8->value;
          pTVar9 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)local_40);
          if ((EVar1 != pTVar9->value) ||
             (pVVar3 = pTVar8->element,
             pTVar8 = SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                      Iterator::Data((Iterator *)local_40), pVVar3 != pTVar8->element)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobHashTable.h"
                               ,0x14a,
                               "(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element)"
                               ,"Huh??");
            if (!bVar6) goto LAB_0049c0dd;
            *puVar7 = 0;
          }
          if (iter2.list ==
              (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar6) goto LAB_0049c0dd;
            *puVar7 = 0;
          }
          pSVar2 = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                   ((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          iter2.list = (SListBase<HashBucket<ExprHash,_Value_*>,_Memory::ArenaAllocator,_RealCount>
                        *)0x0;
          if ((undefined1  [8])pSVar2 != local_40) {
            iter2.list = pSVar2;
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < *(uint *)&iter.last[1].next);
  }
  return;
}

Assistant:

void And(ValueHashTable *this2)
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            _TYPENAME SListBase<HashBucket>::Iterator iter2(&this2->table[i]);
            iter2.Next();
            FOREACH_SLISTBASE_ENTRY_EDITING(HashBucket, bucket, &this->table[i], iter)
            {
                while (iter2.IsValid() && bucket.value < iter2.Data().value)
                {
                    iter2.Next();
                }

                if (!iter2.IsValid() || bucket.value != iter2.Data().value || bucket.element != iter2.Data().element)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(false);
#endif
                    continue;
                }
                else
                {
                    AssertMsg(bucket.value == iter2.Data().value && bucket.element == iter2.Data().element, "Huh??");
                }
                iter2.Next();
            } NEXT_SLISTBASE_ENTRY_EDITING;
        }
    }